

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

string * __thiscall
pybind11::detail::error_fetch_and_normalize::format_value_and_trace_abi_cxx11_
          (string *__return_storage_ptr__,error_fetch_and_normalize *this)

{
  handle hVar1;
  pointer pcVar2;
  PyObject *pPVar3;
  uint __val;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  string *psVar8;
  long *plVar9;
  PyTypeObject *pPVar10;
  PyObject *pPVar11;
  ulong uVar12;
  uint __len;
  PyTypeObject *pPVar13;
  string __str;
  object value_bytes;
  object value_str;
  string message_error_string;
  Py_ssize_t length;
  char *buffer;
  undefined1 local_e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string *local_a8;
  handle local_a0 [2];
  PyObject local_90;
  PyObject *local_80;
  object local_78;
  object local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  long local_40;
  long local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_a8 = __return_storage_ptr__;
  if ((this->m_value).super_handle.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x16cb31);
  }
  else {
    local_70.super_handle.m_ptr = (handle)PyObject_Str();
    if (local_70.super_handle.m_ptr == (PyObject *)0x0) {
      error_fetch_and_normalize
                ((error_fetch_and_normalize *)local_e8,"pybind11::detail::error_string");
      psVar8 = error_string_abi_cxx11_((error_fetch_and_normalize *)local_e8);
      pcVar2 = (psVar8->_M_dataplus)._M_p;
      local_a0[0].m_ptr = &local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar2,pcVar2 + psVar8->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._24_8_ != &local_c0) {
        operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
      }
      object::~object((object *)(local_e8 + 0x10));
      object::~object((object *)(local_e8 + 8));
      object::~object((object *)local_e8);
      std::__cxx11::string::operator=((string *)&local_68,(string *)local_a0);
      if (local_a0[0].m_ptr != &local_90) {
        operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x16caeb);
    }
    else {
      local_78.super_handle.m_ptr =
           (handle)PyUnicode_AsEncodedString(local_70.super_handle.m_ptr,"utf-8","backslashreplace")
      ;
      if (local_78.super_handle.m_ptr == (PyObject *)0x0) {
        error_fetch_and_normalize
                  ((error_fetch_and_normalize *)local_e8,"pybind11::detail::error_string");
        psVar8 = error_string_abi_cxx11_((error_fetch_and_normalize *)local_e8);
        pcVar2 = (psVar8->_M_dataplus)._M_p;
        local_a0[0].m_ptr = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,pcVar2,pcVar2 + psVar8->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._24_8_ != &local_c0) {
          operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
        }
        object::~object((object *)(local_e8 + 0x10));
        object::~object((object *)(local_e8 + 8));
        object::~object((object *)local_e8);
        std::__cxx11::string::operator=((string *)&local_68,(string *)local_a0);
        if (local_a0[0].m_ptr != &local_90) {
          operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x16caeb);
      }
      else {
        local_38 = 0;
        local_40 = 0;
        iVar5 = PyBytes_AsStringAndSize(local_78.super_handle.m_ptr);
        if (iVar5 == -1) {
          error_fetch_and_normalize
                    ((error_fetch_and_normalize *)local_e8,"pybind11::detail::error_string");
          psVar8 = error_string_abi_cxx11_((error_fetch_and_normalize *)local_e8);
          pcVar2 = (psVar8->_M_dataplus)._M_p;
          local_a0[0].m_ptr = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar2,pcVar2 + psVar8->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._24_8_ != &local_c0) {
            operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
          }
          object::~object((object *)(local_e8 + 0x10));
          object::~object((object *)(local_e8 + 8));
          object::~object((object *)local_e8);
          std::__cxx11::string::operator=((string *)&local_68,(string *)local_a0);
          if (local_a0[0].m_ptr != &local_90) {
            operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
          }
          std::__cxx11::string::_M_replace
                    ((ulong)__return_storage_ptr__,0,
                     (char *)__return_storage_ptr__->_M_string_length,0x16caeb);
        }
        else {
          local_e8._0_8_ = (PyObject *)(local_e8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e8,local_38,local_40 + local_38);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
          if ((PyObject *)local_e8._0_8_ != (PyObject *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
          }
        }
      }
      object::~object(&local_78);
    }
    object::~object(&local_70);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x16cb47);
  }
  local_80 = (this->m_trace).super_handle.m_ptr;
  pPVar3 = local_80;
  if (local_80 != (PyObject *)0x0) {
    do {
      pPVar11 = pPVar3;
      pPVar3 = (PyObject *)pPVar11[1].ob_refcnt;
    } while (pPVar3 != (PyObject *)0x0);
    pPVar13 = pPVar11[1].ob_type;
    if (pPVar13 != (PyTypeObject *)0x0) {
      (pPVar13->ob_base).ob_base.ob_refcnt = (pPVar13->ob_base).ob_base.ob_refcnt + 1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (pPVar13 != (PyTypeObject *)0x0) {
      hVar1.m_ptr = (PyObject *)(local_e8 + 0x10);
      do {
        plVar9 = (long *)PyFrame_GetCode(pPVar13);
        uVar6 = PyFrame_GetLineNumber(pPVar13);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_a0[0].m_ptr = (PyObject *)plVar9[0xd];
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   local_a0);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_e8._0_8_);
        if ((PyObject *)local_e8._0_8_ != hVar1.m_ptr) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        __val = -uVar6;
        if (0 < (int)uVar6) {
          __val = uVar6;
        }
        __len = 1;
        if (9 < __val) {
          uVar12 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar7 = (uint)uVar12;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_0011c3d2;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_0011c3d2;
            }
            if (uVar7 < 10000) goto LAB_0011c3d2;
            uVar12 = uVar12 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar7);
          __len = __len + 1;
        }
LAB_0011c3d2:
        local_e8._0_8_ = hVar1.m_ptr;
        std::__cxx11::string::_M_construct((ulong)local_e8,(char)__len - (char)((int)uVar6 >> 0x1f))
        ;
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_e8._0_8_ + (ulong)(uVar6 >> 0x1f)),__len,__val);
        __return_storage_ptr__ = local_a8;
        std::__cxx11::string::_M_append((char *)local_a8,local_e8._0_8_);
        if ((PyObject *)local_e8._0_8_ != hVar1.m_ptr) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_a0[0].m_ptr = (PyObject *)plVar9[0xe];
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   local_a0);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_e8._0_8_);
        if ((PyObject *)local_e8._0_8_ != hVar1.m_ptr) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        *plVar9 = *plVar9 + -1;
        if (*plVar9 == 0) {
          _Py_Dealloc(plVar9);
        }
        pPVar10 = (PyTypeObject *)PyFrame_GetBack(pPVar13);
        (pPVar13->ob_base).ob_base.ob_refcnt = (pPVar13->ob_base).ob_base.ob_refcnt + -1;
        if ((pPVar13->ob_base).ob_base.ob_refcnt == 0) {
          _Py_Dealloc(pPVar13);
        }
        pPVar13 = pPVar10;
      } while (pPVar10 != (PyTypeObject *)0x0);
    }
  }
  if (local_68._M_string_length != 0) {
    if (local_80 == (PyObject *)0x0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: ",&local_68);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_e8._0_8_);
    if ((PyObject *)local_e8._0_8_ != (PyObject *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_value_and_trace() const {
        std::string result;
        std::string message_error_string;
        if (m_value) {
            auto value_str = reinterpret_steal<object>(PyObject_Str(m_value.ptr()));
            constexpr const char *message_unavailable_exc
                = "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>";
            if (!value_str) {
                message_error_string = detail::error_string();
                result = message_unavailable_exc;
            } else {
                // Not using `value_str.cast<std::string>()`, to not potentially throw a secondary
                // error_already_set that will then result in process termination (#4288).
                auto value_bytes = reinterpret_steal<object>(
                    PyUnicode_AsEncodedString(value_str.ptr(), "utf-8", "backslashreplace"));
                if (!value_bytes) {
                    message_error_string = detail::error_string();
                    result = message_unavailable_exc;
                } else {
                    char *buffer = nullptr;
                    Py_ssize_t length = 0;
                    if (PyBytes_AsStringAndSize(value_bytes.ptr(), &buffer, &length) == -1) {
                        message_error_string = detail::error_string();
                        result = message_unavailable_exc;
                    } else {
                        result = std::string(buffer, static_cast<std::size_t>(length));
                    }
                }
            }
        } else {
            result = "<MESSAGE UNAVAILABLE>";
        }
        if (result.empty()) {
            result = "<EMPTY MESSAGE>";
        }

        bool have_trace = false;
        if (m_trace) {
#if !defined(PYPY_VERSION)
            auto *tb = reinterpret_cast<PyTracebackObject *>(m_trace.ptr());

            // Get the deepest trace possible.
            while (tb->tb_next) {
                tb = tb->tb_next;
            }

            PyFrameObject *frame = tb->tb_frame;
            Py_XINCREF(frame);
            result += "\n\nAt:\n";
            while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
                PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
                PyCodeObject *f_code = frame->f_code;
                Py_INCREF(f_code);
#    endif
                int lineno = PyFrame_GetLineNumber(frame);
                result += "  ";
                result += handle(f_code->co_filename).cast<std::string>();
                result += '(';
                result += std::to_string(lineno);
                result += "): ";
                result += handle(f_code->co_name).cast<std::string>();
                result += '\n';
                Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
                auto *b_frame = PyFrame_GetBack(frame);
#    else
                auto *b_frame = frame->f_back;
                Py_XINCREF(b_frame);
#    endif
                Py_DECREF(frame);
                frame = b_frame;
            }

            have_trace = true;
#endif //! defined(PYPY_VERSION)
        }

        if (!message_error_string.empty()) {
            if (!have_trace) {
                result += '\n';
            }
            result += "\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: " + message_error_string;
        }

        return result;
    }